

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O0

int av1_get_pred_context_uni_comp_ref_p1(MACROBLOCKD *xd)

{
  uint uVar1;
  int local_20;
  int pred_context;
  int last3_or_gld_count;
  int last2_count;
  uint8_t *ref_counts;
  MACROBLOCKD *xd_local;
  
  uVar1 = (uint)xd->neighbors_ref_counts[3] + (uint)xd->neighbors_ref_counts[4];
  if (xd->neighbors_ref_counts[2] == uVar1) {
    local_20 = 1;
  }
  else {
    local_20 = 2;
    if (xd->neighbors_ref_counts[2] < uVar1) {
      local_20 = 0;
    }
  }
  return local_20;
}

Assistant:

int av1_get_pred_context_uni_comp_ref_p1(const MACROBLOCKD *xd) {
  const uint8_t *const ref_counts = &xd->neighbors_ref_counts[0];

  // Count of LAST2
  const int last2_count = ref_counts[LAST2_FRAME];
  // Count of LAST3 or GOLDEN
  const int last3_or_gld_count =
      ref_counts[LAST3_FRAME] + ref_counts[GOLDEN_FRAME];

  const int pred_context = (last2_count == last3_or_gld_count)
                               ? 1
                               : ((last2_count < last3_or_gld_count) ? 0 : 2);

  assert(pred_context >= 0 && pred_context < UNI_COMP_REF_CONTEXTS);
  return pred_context;
}